

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::BasicCopyTexSubImageCubeCase::createTexture
          (BasicCopyTexSubImageCubeCase *this)

{
  ContextWrapper *this_00;
  float fVar1;
  float fVar2;
  byte bVar3;
  int iVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  int iVar8;
  deUint32 dVar9;
  undefined4 extraout_var;
  Context *pCVar10;
  NotSupportedError *this_01;
  ChannelOrder CVar11;
  int iVar12;
  uint uVar13;
  bool bVar14;
  uint uVar15;
  int ndx;
  long lVar16;
  int face;
  uint uVar17;
  long lVar18;
  float fVar19;
  deUint32 tex;
  Vec4 colorB;
  Vec4 colorA;
  PixelBufferAccess local_208;
  Random rnd;
  TextureLevel data;
  float local_1a8 [6];
  TextureFormat fmt;
  GradientShader shader;
  
  iVar4 = (*((this->super_TextureCubeSpecCase).super_TextureSpecCase.super_TestCase.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  lVar18 = CONCAT44(extraout_var,iVar4);
  bVar14 = false;
  if ((0 < *(int *)(lVar18 + 8)) && (bVar14 = false, 0 < *(int *)(lVar18 + 0xc))) {
    bVar14 = 0 < *(int *)(lVar18 + 0x10);
  }
  iVar4 = *(int *)(lVar18 + 0x14);
  fmt = glu::mapGLTransferFormat(this->m_format,this->m_dataType);
  CVar11 = fmt.order;
  bVar3 = (byte)fmt.order;
  tex = 0;
  tcu::TextureLevel::TextureLevel(&data,&fmt);
  dVar5 = deStringHash((this->super_TextureCubeSpecCase).super_TextureSpecCase.super_TestCase.
                       super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar5);
  FboTestUtil::GradientShader::GradientShader(&shader,TYPE_FLOAT_VEC4);
  this_00 = &(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper;
  pCVar10 = sglr::ContextWrapper::getCurrentContext(this_00);
  dVar5 = (*pCVar10->_vptr_Context[0x75])(pCVar10,&shader);
  if ((CVar11 == A || bVar14) &&
     ((RGBA < CVar11 || (0xedU >> (bVar3 & 0x1f) & 1) != 0) || 0 < iVar4)) {
    sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
    sglr::ContextWrapper::glBindTexture(this_00,0x8513,tex);
    sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
    if (0 < (this->super_TextureCubeSpecCase).m_numLevels) {
      iVar4 = 0;
      do {
        iVar12 = (this->super_TextureCubeSpecCase).m_size >> ((byte)iVar4 & 0x1f);
        if (iVar12 < 2) {
          iVar12 = 1;
        }
        tcu::TextureLevel::setSize(&data,iVar12,iVar12,1);
        lVar18 = 0;
        do {
          local_208.super_ConstPixelBufferAccess.m_format.order = R;
          local_208.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
          local_208.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
          local_208.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
          colorB.m_data[0] = 1.0;
          colorB.m_data[1] = 1.0;
          colorB.m_data[2] = 1.0;
          colorB.m_data[3] = 1.0;
          colorA.m_data[0] = 0.0;
          colorA.m_data[1] = 0.0;
          colorA.m_data[2] = 0.0;
          colorA.m_data[3] = 0.0;
          lVar16 = 0;
          do {
            fVar1 = (float)local_208.super_ConstPixelBufferAccess.m_size.m_data[lVar16 + -2];
            fVar2 = colorB.m_data[lVar16];
            fVar19 = deRandom_getFloat(&rnd.m_rnd);
            colorA.m_data[lVar16] = (fVar2 - fVar1) * fVar19 + fVar1;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 4);
          local_208.super_ConstPixelBufferAccess.m_format.order = R;
          local_208.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
          local_208.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
          local_208.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
          local_1a8[0] = 1.0;
          local_1a8[1] = 1.0;
          local_1a8[2] = 1.0;
          local_1a8[3] = 1.0;
          colorB.m_data[0] = 0.0;
          colorB.m_data[1] = 0.0;
          colorB.m_data[2] = 0.0;
          colorB.m_data[3] = 0.0;
          lVar16 = 0;
          do {
            fVar1 = (float)local_208.super_ConstPixelBufferAccess.m_size.m_data[lVar16 + -2];
            fVar2 = local_1a8[lVar16];
            fVar19 = deRandom_getFloat(&rnd.m_rnd);
            colorB.m_data[lVar16] = (fVar2 - fVar1) * fVar19 + fVar1;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 4);
          dVar6 = deRandom_getUint32(&rnd.m_rnd);
          tcu::TextureLevel::getAccess(&local_208,&data);
          tcu::fillWithGrid(&local_208,dVar6 % 0xf + 2,&colorA,&colorB);
          dVar6 = (&s_cubeMapFaces)[lVar18];
          dVar7 = this->m_format;
          dVar9 = this->m_dataType;
          tcu::TextureLevel::getAccess(&local_208,&data);
          sglr::ContextWrapper::glTexImage2D
                    (this_00,dVar6,iVar4,dVar7,iVar12,iVar12,0,dVar7,dVar9,
                     local_208.super_ConstPixelBufferAccess.m_data);
          lVar18 = lVar18 + 1;
        } while (lVar18 != 6);
        iVar4 = iVar4 + 1;
      } while (iVar4 < (this->super_TextureCubeSpecCase).m_numLevels);
    }
    pCVar10 = sglr::ContextWrapper::getCurrentContext(this_00);
    local_208.super_ConstPixelBufferAccess.m_format.order = R;
    local_208.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
    local_208.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
    local_208.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
    colorA.m_data[0] = 1.0;
    colorA.m_data[1] = 1.0;
    colorA.m_data[2] = 1.0;
    colorA.m_data[3] = 1.0;
    FboTestUtil::GradientShader::setGradient(&shader,pCVar10,dVar5,(Vec4 *)&local_208,&colorA);
    pCVar10 = sglr::ContextWrapper::getCurrentContext(this_00);
    local_208.super_ConstPixelBufferAccess.m_format.order = 0xbf800000;
    local_208.super_ConstPixelBufferAccess.m_format.type = 0xbf800000;
    local_208.super_ConstPixelBufferAccess.m_size.m_data._0_8_ =
         local_208.super_ConstPixelBufferAccess.m_size.m_data._0_8_ & 0xffffffff00000000;
    colorA.m_data[0] = 1.0;
    colorA.m_data[1] = 1.0;
    colorA.m_data._8_8_ = colorA.m_data._8_8_ & 0xffffffff00000000;
    sglr::drawQuad(pCVar10,dVar5,(Vec3 *)&local_208,(Vec3 *)&colorA);
    if (0 < (this->super_TextureCubeSpecCase).m_numLevels) {
      iVar4 = 0;
      do {
        uVar17 = (this->super_TextureCubeSpecCase).m_size >> ((byte)iVar4 & 0x1f);
        if ((int)uVar17 < 2) {
          uVar17 = 1;
        }
        lVar18 = 0;
        do {
          dVar5 = deRandom_getUint32(&rnd.m_rnd);
          uVar13 = dVar5 % uVar17;
          dVar5 = deRandom_getUint32(&rnd.m_rnd);
          uVar15 = dVar5 % uVar17;
          dVar5 = deRandom_getUint32(&rnd.m_rnd);
          dVar6 = deRandom_getUint32(&rnd.m_rnd);
          iVar12 = sglr::ContextWrapper::getWidth(this_00);
          dVar7 = deRandom_getUint32(&rnd.m_rnd);
          iVar8 = sglr::ContextWrapper::getHeight(this_00);
          dVar9 = deRandom_getUint32(&rnd.m_rnd);
          sglr::ContextWrapper::glCopyTexSubImage2D
                    (this_00,*(deUint32 *)((long)&s_cubeMapFaces + lVar18),iVar4,
                     dVar5 % (uVar17 - uVar13),dVar6 % (uVar17 - uVar15),dVar7 % (iVar12 - uVar13),
                     dVar9 % (iVar8 - uVar15),uVar13 + 1,uVar15 + 1);
          lVar18 = lVar18 + 4;
        } while (lVar18 != 0x18);
        iVar4 = iVar4 + 1;
      } while (iVar4 < (this->super_TextureCubeSpecCase).m_numLevels);
    }
    sglr::ShaderProgram::~ShaderProgram(&shader.super_ShaderProgram);
    tcu::TextureLevel::~TextureLevel(&data);
    return;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Copying from current framebuffer is not supported",
             glcts::fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureSpecificationTests.cpp"
             ,0x80f);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void createTexture (void)
	{
		const tcu::RenderTarget&	renderTarget	= TestCase::m_context.getRenderContext().getRenderTarget();
		bool						targetHasRGB	= renderTarget.getPixelFormat().redBits > 0 && renderTarget.getPixelFormat().greenBits > 0 && renderTarget.getPixelFormat().blueBits > 0;
		bool						targetHasAlpha	= renderTarget.getPixelFormat().alphaBits > 0;
		tcu::TextureFormat			fmt				= glu::mapGLTransferFormat(m_format, m_dataType);
		bool						texHasRGB		= fmt.order != tcu::TextureFormat::A;
		bool						texHasAlpha		= fmt.order == tcu::TextureFormat::RGBA || fmt.order == tcu::TextureFormat::LA || fmt.order == tcu::TextureFormat::A;
		deUint32					tex				= 0;
		tcu::TextureLevel			data			(fmt);
		de::Random					rnd				(deStringHash(getName()));
		GradientShader				shader			(glu::TYPE_FLOAT_VEC4);
		deUint32					shaderID		= getCurrentContext()->createProgram(&shader);

		if ((texHasRGB && !targetHasRGB) || (texHasAlpha && !targetHasAlpha))
			throw tcu::NotSupportedError("Copying from current framebuffer is not supported", "", __FILE__, __LINE__);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int levelSize = de::max(1, m_size >> ndx);

			data.setSize(levelSize, levelSize);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				Vec4	colorA		= randomVector<4>(rnd);
				Vec4	colorB		= randomVector<4>(rnd);
				int		cellSize	= rnd.getInt(2, 16);

				tcu::fillWithGrid(data.getAccess(), cellSize, colorA, colorB);
				glTexImage2D(s_cubeMapFaces[face], ndx, m_format, levelSize, levelSize, 0, m_format, m_dataType, data.getAccess().getDataPtr());
			}
		}

		// Fill render target with gradient.
		shader.setGradient(*getCurrentContext(), shaderID, Vec4(0.0f), Vec4(1.0f));
		sglr::drawQuad(*getCurrentContext(), shaderID, tcu::Vec3(-1.0f, -1.0f, 0.0f), tcu::Vec3(1.0f, 1.0f, 0.0f));

		// Re-specify parts of each face and level.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int levelSize = de::max(1, m_size >> ndx);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				int		w			= rnd.getInt(1, levelSize);
				int		h			= rnd.getInt(1, levelSize);
				int		xo			= rnd.getInt(0, levelSize-w);
				int		yo			= rnd.getInt(0, levelSize-h);

				int		x			= rnd.getInt(0, getWidth() - w);
				int		y			= rnd.getInt(0, getHeight() - h);

				glCopyTexSubImage2D(s_cubeMapFaces[face], ndx, xo, yo, x, y, w, h);
			}
		}
	}